

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

void nlohmann::adl_serializer<Eigen::Matrix<double,1,3,1,1,3>,void>::
     from_json<nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
               (basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *json,Vector<3> *point)

{
  size_type sVar1;
  const_reference j;
  Scalar *val;
  int i;
  
  sVar1 = basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size(json);
  if (sVar1 == 3) {
    for (sVar1 = 0; sVar1 != 3; sVar1 = sVar1 + 1) {
      j = basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::at(json,sVar1);
      val = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)point,sVar1);
      detail::
      get_arithmetic_value<nlohmann::basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                (j,val);
    }
    return;
  }
  __assert_fail("json.size() == point.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/include/anurbs/Algorithm/../Geometry/../Model/Json.h"
                ,0x4c,
                "static void nlohmann::adl_serializer<Eigen::Matrix<double, 1, 3>>::from_json(const TJson &, anurbs::linear_algebra::Vector<3> &) [TJson = nlohmann::basic_json<anurbs::FiFoMap>]"
               );
}

Assistant:

static void from_json(const TJson& json, anurbs::linear_algebra::Vector<3>& point)
        {
            assert(json.size() == point.size());

            for (int i = 0; i < point.size(); i++) {
                json.at(i).get_to(point[i]);
            }
        }